

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O3

void wasm::
     CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
     ::doStartTryTable(RelevantLiveLocalsWalker *self,Expression **currp)

{
  Expression *pEVar1;
  Expression *local_20;
  
  pEVar1 = *currp;
  if (pEVar1->_id == TryTableId) {
    std::
    vector<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
    ::emplace_back<>(&(self->
                      super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                      ).
                      super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                      .throwingInstsStack);
    local_20 = pEVar1;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
               &(self->
                super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                ).
                super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                .tryStack,&local_20);
    return;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,"T *wasm::Expression::cast() [T = wasm::TryTable]");
}

Assistant:

static void doStartTryTable(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<TryTable>();
    self->throwingInstsStack.emplace_back();
    self->tryStack.push_back(curr);
  }